

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O1

int __thiscall JetHead::CircularBuffer::peekLine(CircularBuffer *this,string *line,char *terminal)

{
  byte *pbVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  byte *pbVar5;
  AutoLock lock;
  AutoLock local_40;
  
  AutoLock::AutoLock(&local_40,&this->mLock);
  sVar3 = strlen(terminal);
  if (this->mLen != 0) {
    pbVar1 = this->mReadPtr;
    iVar2 = 0;
    pbVar5 = pbVar1;
    do {
      if ((uint)*pbVar5 == (int)terminal[iVar2]) {
        iVar2 = iVar2 + 1;
      }
      else {
        iVar2 = 0;
      }
      iVar4 = (int)sVar3;
      if (iVar2 == iVar4) break;
      pbVar5 = pbVar5 + 1;
      if (pbVar5 == this->mEnd) {
        pbVar5 = this->mBuffer;
      }
    } while (pbVar5 != this->mWritePtr);
    if (iVar2 == iVar4) {
      if (pbVar5 + 1 < pbVar1) {
        std::__cxx11::string::_M_replace((ulong)line,0,(char *)line->_M_string_length,(ulong)pbVar1)
        ;
        std::__cxx11::string::append((char *)line,(ulong)this->mBuffer);
      }
      else {
        std::__cxx11::string::_M_replace((ulong)line,0,(char *)line->_M_string_length,(ulong)pbVar1)
        ;
      }
      iVar4 = (int)line->_M_string_length + iVar4;
      goto LAB_00115d72;
    }
  }
  iVar4 = 0;
LAB_00115d72:
  AutoLock::~AutoLock(&local_40);
  return iVar4;
}

Assistant:

int CircularBuffer::peekLine( JHSTD::string &line, const char *terminal )
{
	AutoLock lock( mLock );
	int term_len = strlen( terminal );
	int state = 0;
	uint8_t *ptr = mReadPtr;
	bool found = false;
	
	if ( mLen == 0 ) 
		return 0;
	
	do {
		if ( *ptr == terminal[ state ] )
			state += 1;
		else
			state = 0;
	
		if ( state == term_len )
		{
			found = true;
			break;
		}
		
		ptr += 1;
		if ( ptr == mEnd )
			ptr = mBuffer;
	} while( ptr != mWritePtr );
	
	if ( found )
	{
		// move passed the terminals last char, don't care about wrapping here.
		ptr += 1;

		// if wrap
		if ( ptr < mReadPtr )
		{
			line.assign( (char*)mReadPtr, mEnd - mReadPtr );
			line.append( (char*)mBuffer, ptr - mBuffer - term_len );
		}
		else
			line.assign( (char*)mReadPtr, ptr - mReadPtr - term_len );

		return line.length() + term_len;
	}

	return 0;
}